

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_instance.c
# Opt level: O0

apx_error_t
apx_portInstance_derive_properties(apx_portInstance_t *self,uint32_t offset,uint32_t *size)

{
  apx_program_t *local_40;
  apx_error_t result;
  uint32_t *size_local;
  uint32_t offset_local;
  apx_portInstance_t *self_local;
  
  if ((self == (apx_portInstance_t *)0x0) || (size == (uint32_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    if (self->port_type == '\x01') {
      local_40 = self->pack_program;
    }
    else {
      local_40 = self->unpack_program;
    }
    self_local._4_4_ = process_info_from_program_header(self,local_40);
    if (self_local._4_4_ == 0) {
      self->data_offset = offset;
      *size = self->data_size;
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_portInstance_derive_properties(apx_portInstance_t* self, uint32_t offset, uint32_t* size)
{
   if ( (self != NULL) && (size != NULL) )
   {
      apx_error_t result = APX_NO_ERROR;
      result = process_info_from_program_header(self, (self->port_type == APX_PROVIDE_PORT) ? self->pack_program : self->unpack_program);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      self->data_offset = offset;
      *size = self->data_size;
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}